

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCPluginAPI.cxx
# Opt level: O3

void __thiscall
cmCPluginAPISourceFileMap::~cmCPluginAPISourceFileMap(cmCPluginAPISourceFileMap *this)

{
  _Base_ptr p_Var1;
  _Rb_tree_node_base *p_Var2;
  
  for (p_Var2 = (this->
                super_map<cmSourceFile_*,_cmCPluginAPISourceFile_*,_std::less<cmSourceFile_*>,_std::allocator<std::pair<cmSourceFile_*const,_cmCPluginAPISourceFile_*>_>_>
                )._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var2 !=
      &(this->
       super_map<cmSourceFile_*,_cmCPluginAPISourceFile_*,_std::less<cmSourceFile_*>,_std::allocator<std::pair<cmSourceFile_*const,_cmCPluginAPISourceFile_*>_>_>
       )._M_t._M_impl.super__Rb_tree_header;
      p_Var2 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var2)) {
    p_Var1 = p_Var2[1]._M_parent;
    if (p_Var1 != (_Base_ptr)0x0) {
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty>_>_>
      ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty>_>_>
                   *)(p_Var1 + 4));
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&p_Var1[3]._M_parent);
      if (p_Var1[2]._M_parent != (_Base_ptr)&p_Var1[2]._M_right) {
        operator_delete(p_Var1[2]._M_parent,(ulong)((long)&(p_Var1[2]._M_right)->_M_color + 1));
      }
      if (p_Var1[1]._M_parent != (_Base_ptr)&p_Var1[1]._M_right) {
        operator_delete(p_Var1[1]._M_parent,(ulong)((long)&(p_Var1[1]._M_right)->_M_color + 1));
      }
      if (p_Var1->_M_parent != (_Base_ptr)&p_Var1->_M_right) {
        operator_delete(p_Var1->_M_parent,(ulong)((long)&p_Var1->_M_right->_M_color + 1));
      }
    }
    operator_delete(p_Var1,0xb0);
  }
  std::
  _Rb_tree<cmSourceFile_*,_std::pair<cmSourceFile_*const,_cmCPluginAPISourceFile_*>,_std::_Select1st<std::pair<cmSourceFile_*const,_cmCPluginAPISourceFile_*>_>,_std::less<cmSourceFile_*>,_std::allocator<std::pair<cmSourceFile_*const,_cmCPluginAPISourceFile_*>_>_>
  ::~_Rb_tree((_Rb_tree<cmSourceFile_*,_std::pair<cmSourceFile_*const,_cmCPluginAPISourceFile_*>,_std::_Select1st<std::pair<cmSourceFile_*const,_cmCPluginAPISourceFile_*>_>,_std::less<cmSourceFile_*>,_std::allocator<std::pair<cmSourceFile_*const,_cmCPluginAPISourceFile_*>_>_>
               *)this);
  return;
}

Assistant:

~cmCPluginAPISourceFileMap()
    {
    for(iterator i=this->begin(); i != this->end(); ++i)
      {
      delete i->second;
      }
    }